

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.hpp
# Opt level: O0

Vector3<double> * OpenMD::cross<double>(Vector3<double> *v1,Vector3<double> *v2)

{
  double *pdVar1;
  Vector3<double> *in_RDX;
  Vector3<double> *in_RSI;
  Vector3<double> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector3<double> *result;
  
  Vector3<double>::Vector3((Vector3<double> *)0x1b88ab);
  dVar2 = Vector3<double>::y(in_RSI);
  dVar3 = Vector3<double>::z(in_RDX);
  dVar4 = Vector3<double>::z(in_RSI);
  dVar5 = Vector3<double>::y(in_RDX);
  pdVar1 = Vector3<double>::x(in_RDI);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = Vector3<double>::z(in_RSI);
  dVar3 = Vector3<double>::x(in_RDX);
  dVar4 = Vector3<double>::x(in_RSI);
  dVar5 = Vector3<double>::z(in_RDX);
  pdVar1 = Vector3<double>::y(in_RDI);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = Vector3<double>::x(in_RSI);
  dVar3 = Vector3<double>::y(in_RDX);
  dVar4 = Vector3<double>::y(in_RSI);
  dVar5 = Vector3<double>::x(in_RDX);
  pdVar1 = Vector3<double>::z(in_RDI);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  return in_RDI;
}

Assistant:

inline Vector3<Real> cross(const Vector3<Real>& v1, const Vector3<Real>& v2) {
    Vector3<Real> result;

    result.x() = v1.y() * v2.z() - v1.z() * v2.y();
    result.y() = v1.z() * v2.x() - v1.x() * v2.z();
    result.z() = v1.x() * v2.y() - v1.y() * v2.x();

    return result;
  }